

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmGraphicsShaderTestUtil.cpp
# Opt level: O1

void vkt::SpirVAssembly::createMultipleEntries(SourceCollections *dst,InstanceContext *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  SpirVAsmSource *pSVar2;
  SpirVAsmCollection *this;
  string local_30;
  
  paVar1 = &local_30.field_2;
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"vert","");
  this = &dst->spirvAsmSources;
  pSVar2 = ::vk::ProgramCollection<vk::SpirVAsmSource>::add(this,&local_30);
  ::vk::operator<<(pSVar2,(char (*) [3408])
                          "OpCapability Shader\nOpMemoryModel Logical GLSL450\nOpEntryPoint Vertex %main \"vert1\" %Position %vtxColor %color %vtxPosition %vertex_id %instance_id\nOpEntryPoint Vertex %main2 \"vert2\" %Position %vtxColor %color %vtxPosition %vertex_id %instance_id\nOpName %main \"vert1\"\nOpName %main2 \"vert2\"\nOpName %vtxPosition \"vtxPosition\"\nOpName %Position \"position\"\nOpName %vtxColor \"vtxColor\"\nOpName %color \"color\"\nOpName %vertex_id \"gl_VertexIndex\"\nOpName %instance_id \"gl_InstanceIndex\"\nOpDecorate %vtxPosition Location 2\nOpDecorate %Position Location 0\nOpDecorate %vtxColor Location 1\nOpDecorate %color Location 1\nOpDecorate %vertex_id BuiltIn VertexIndex\nOpDecorate %instance_id BuiltIn InstanceIndex\n%void = OpTypeVoid\n%bool = OpTypeBool\n%i32 = OpTypeInt 32 1\n%u32 = OpTypeInt 32 0\n%f32 = OpTypeFloat 32\n%v3f32 = OpTypeVector %f32 3\n%v4i32 = OpTypeVector %i32 4\n%v4f32 = OpTypeVector %f32 4\n%v4bool = OpTypeVector %bool 4\n%v4f32_function = OpTypeFunction %v4f32 %v4f32\n%fun = OpTypeFunction %void\n%ip_f32 = OpTypePointer Input %f32\n%ip_i32 = OpTypePointer Input %i32\n%ip_v3f32 = OpTypePointer Input %v3f32\n%ip_v4f32 = OpTypePointer Input %v4f32\n%op_f32 = OpTypePointer Output %f32\n%op_v4f32 = OpTypePointer Output %v4f32\n%fp_f32   = OpTypePointer Function %f32\n%fp_i32   = OpTypePointer Function %i32\n%fp_v4f32 = OpTypePointer Function %v4f32\n%c_f32_1 = OpConstant %f32 1.0\n%c_f32_0 = OpConstant %f32 0.0\n%c_f32_0_5 = OpConstant %f32 0.5\n%c_f32_n1  = OpConstant %f32 -1.\n%c_f32_7 = OpConstant %f32 7.0\n%c_f32_8 = OpConstant %f32 8.0\n%c_i32_0 = OpConstant %i32 0\n%c_i32_1 = OpConstant %i32 1\n%c_i32_2 = OpConstant %i32 2\n%c_i32_3 = OpConstant %i32 3\n%c_i32_4 = OpConstant %i32 4\n%c_u32_0 = OpConstant %u32 0\n%c_u32_1 = OpConstant %u32 1\n%c_u32_2 = OpConstant %u32 2\n%c_u32_3 = OpConstant %u32 3\n%c_u32_32 = OpConstant %u32 32\n%c_u32_4 = OpConstant %u32 4\n%c_u32_31_bits = OpConstant %u32 0x7FFFFFFF\n%c_v4f32_1_1_1_1 = OpConstantComposite %v4f32 %c_f32_1 %c_f32_1 %c_f32_1 %c_f32_1\n%c_v4f32_1_0_0_1 = OpConstantComposite %v4f32 %c_f32_1 %c_f32_0 %c_f32_0 %c_..." /* TRUNCATED STRING LITERAL */
                  );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"frag","");
  pSVar2 = ::vk::ProgramCollection<vk::SpirVAsmSource>::add(this,&local_30);
  ::vk::operator<<(pSVar2,(char (*) [2788])
                          "OpCapability Shader\nOpMemoryModel Logical GLSL450\nOpEntryPoint Fragment %main \"frag1\" %vtxColor %fragColor\nOpEntryPoint Fragment %main2 \"frag2\" %vtxColor %fragColor\nOpExecutionMode %main OriginUpperLeft\nOpExecutionMode %main2 OriginUpperLeft\nOpName %main \"frag1\"\nOpName %main2 \"frag2\"\nOpName %fragColor \"fragColor\"\nOpName %vtxColor \"vtxColor\"\nOpDecorate %fragColor Location 0\nOpDecorate %vtxColor Location 1\n%void = OpTypeVoid\n%bool = OpTypeBool\n%i32 = OpTypeInt 32 1\n%u32 = OpTypeInt 32 0\n%f32 = OpTypeFloat 32\n%v3f32 = OpTypeVector %f32 3\n%v4i32 = OpTypeVector %i32 4\n%v4f32 = OpTypeVector %f32 4\n%v4bool = OpTypeVector %bool 4\n%v4f32_function = OpTypeFunction %v4f32 %v4f32\n%fun = OpTypeFunction %void\n%ip_f32 = OpTypePointer Input %f32\n%ip_i32 = OpTypePointer Input %i32\n%ip_v3f32 = OpTypePointer Input %v3f32\n%ip_v4f32 = OpTypePointer Input %v4f32\n%op_f32 = OpTypePointer Output %f32\n%op_v4f32 = OpTypePointer Output %v4f32\n%fp_f32   = OpTypePointer Function %f32\n%fp_i32   = OpTypePointer Function %i32\n%fp_v4f32 = OpTypePointer Function %v4f32\n%c_f32_1 = OpConstant %f32 1.0\n%c_f32_0 = OpConstant %f32 0.0\n%c_f32_0_5 = OpConstant %f32 0.5\n%c_f32_n1  = OpConstant %f32 -1.\n%c_f32_7 = OpConstant %f32 7.0\n%c_f32_8 = OpConstant %f32 8.0\n%c_i32_0 = OpConstant %i32 0\n%c_i32_1 = OpConstant %i32 1\n%c_i32_2 = OpConstant %i32 2\n%c_i32_3 = OpConstant %i32 3\n%c_i32_4 = OpConstant %i32 4\n%c_u32_0 = OpConstant %u32 0\n%c_u32_1 = OpConstant %u32 1\n%c_u32_2 = OpConstant %u32 2\n%c_u32_3 = OpConstant %u32 3\n%c_u32_32 = OpConstant %u32 32\n%c_u32_4 = OpConstant %u32 4\n%c_u32_31_bits = OpConstant %u32 0x7FFFFFFF\n%c_v4f32_1_1_1_1 = OpConstantComposite %v4f32 %c_f32_1 %c_f32_1 %c_f32_1 %c_f32_1\n%c_v4f32_1_0_0_1 = OpConstantComposite %v4f32 %c_f32_1 %c_f32_0 %c_f32_0 %c_f32_1\n%c_v4f32_0_5_0_5_0_5_0_5 = OpConstantComposite %v4f32 %c_f32_0_5 %c_f32_0_5 %c_f32_0_5 %c_f32_0_5\n%a1f32 = OpTypeArray %f32 %c_u32_1\n%a2f32 = OpTypeArray %f32 %c_u32_2\n%a3v4f32 = OpTypeArray %v4f32 %c_u32_3\n%a4f32 = OpTypeArray %f32 %c_u32_4\n%a32v4f32 = OpTypeArray %v4f32 %c_u3..." /* TRUNCATED STRING LITERAL */
                  );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"geom","");
  pSVar2 = ::vk::ProgramCollection<vk::SpirVAsmSource>::add(this,&local_30);
  ::vk::operator<<(pSVar2,(char (*) [6486])
                          "OpCapability Geometry\nOpCapability ClipDistance\nOpCapability CullDistance\nOpMemoryModel Logical GLSL450\nOpEntryPoint Geometry %geom1_main \"geom1\" %out_gl_position %gl_in %out_color %in_color\nOpEntryPoint Geometry %geom2_main \"geom2\" %out_gl_position %gl_in %out_color %in_color\nOpExecutionMode %geom1_main Triangles\nOpExecutionMode %geom2_main Triangles\nOpExecutionMode %geom1_main OutputTriangleStrip\nOpExecutionMode %geom2_main OutputTriangleStrip\nOpExecutionMode %geom1_main OutputVertices 3\nOpExecutionMode %geom2_main OutputVertices 3\nOpName %geom1_main \"geom1\"\nOpName %geom2_main \"geom2\"\nOpName %per_vertex_in \"gl_PerVertex\"\nOpMemberName %per_vertex_in 0 \"gl_Position\"\nOpMemberName %per_vertex_in 1 \"gl_PointSize\"\nOpMemberName %per_vertex_in 2 \"gl_ClipDistance\"\nOpMemberName %per_vertex_in 3 \"gl_CullDistance\"\nOpName %gl_in \"gl_in\"\nOpName %out_color \"out_color\"\nOpName %in_color \"in_color\"\nOpDecorate %out_gl_position BuiltIn Position\nOpMemberDecorate %per_vertex_in 0 BuiltIn Position\nOpMemberDecorate %per_vertex_in 1 BuiltIn PointSize\nOpMemberDecorate %per_vertex_in 2 BuiltIn ClipDistance\nOpMemberDecorate %per_vertex_in 3 BuiltIn CullDistance\nOpDecorate %per_vertex_in Block\nOpDecorate %out_color Location 1\nOpDecorate %in_color Location 1\n%void = OpTypeVoid\n%bool = OpTypeBool\n%i32 = OpTypeInt 32 1\n%u32 = OpTypeInt 32 0\n%f32 = OpTypeFloat 32\n%v3f32 = OpTypeVector %f32 3\n%v4i32 = OpTypeVector %i32 4\n%v4f32 = OpTypeVector %f32 4\n%v4bool = OpTypeVector %bool 4\n%v4f32_function = OpTypeFunction %v4f32 %v4f32\n%fun = OpTypeFunction %void\n%ip_f32 = OpTypePointer Input %f32\n%ip_i32 = OpTypePointer Input %i32\n%ip_v3f32 = OpTypePointer Input %v3f32\n%ip_v4f32 = OpTypePointer Input %v4f32\n%op_f32 = OpTypePointer Output %f32\n%op_v4f32 = OpTypePointer Output %v4f32\n%fp_f32   = OpTypePointer Function %f32\n%fp_i32   = OpTypePointer Function %i32\n%fp_v4f32 = OpTypePointer Function %v4f32\n%c_f32_1 = OpConstant %f32 1.0\n%c_f32_0 = OpConstant %f32 0.0\n%c_f32_0_5 = OpConstant %f32 0.5\n%c_f32_n1  = OpConstant %f32 -1.\n%c_f32_7 = OpConstant %f32..." /* TRUNCATED STRING LITERAL */
                  );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"tessc","");
  pSVar2 = ::vk::ProgramCollection<vk::SpirVAsmSource>::add(this,&local_30);
  ::vk::operator<<(pSVar2,(char (*) [6471])
                          "OpCapability Tessellation\nOpMemoryModel Logical GLSL450\nOpEntryPoint TessellationControl %tessc1_main \"tessc1\" %out_color %gl_InvocationID %in_color %out_position %in_position %gl_TessLevelOuter %gl_TessLevelInner\nOpEntryPoint TessellationControl %tessc2_main \"tessc2\" %out_color %gl_InvocationID %in_color %out_position %in_position %gl_TessLevelOuter %gl_TessLevelInner\nOpExecutionMode %tessc1_main OutputVertices 3\nOpExecutionMode %tessc2_main OutputVertices 3\nOpName %tessc1_main \"tessc1\"\nOpName %tessc2_main \"tessc2\"\nOpName %out_color \"out_color\"\nOpName %gl_InvocationID \"gl_InvocationID\"\nOpName %in_color \"in_color\"\nOpName %out_position \"out_position\"\nOpName %in_position \"in_position\"\nOpName %gl_TessLevelOuter \"gl_TessLevelOuter\"\nOpName %gl_TessLevelInner \"gl_TessLevelInner\"\nOpDecorate %out_color Location 1\nOpDecorate %gl_InvocationID BuiltIn InvocationId\nOpDecorate %in_color Location 1\nOpDecorate %out_position Location 2\nOpDecorate %in_position Location 2\nOpDecorate %gl_TessLevelOuter Patch\nOpDecorate %gl_TessLevelOuter BuiltIn TessLevelOuter\nOpDecorate %gl_TessLevelInner Patch\nOpDecorate %gl_TessLevelInner BuiltIn TessLevelInner\n%void = OpTypeVoid\n%bool = OpTypeBool\n%i32 = OpTypeInt 32 1\n%u32 = OpTypeInt 32 0\n%f32 = OpTypeFloat 32\n%v3f32 = OpTypeVector %f32 3\n%v4i32 = OpTypeVector %i32 4\n%v4f32 = OpTypeVector %f32 4\n%v4bool = OpTypeVector %bool 4\n%v4f32_function = OpTypeFunction %v4f32 %v4f32\n%fun = OpTypeFunction %void\n%ip_f32 = OpTypePointer Input %f32\n%ip_i32 = OpTypePointer Input %i32\n%ip_v3f32 = OpTypePointer Input %v3f32\n%ip_v4f32 = OpTypePointer Input %v4f32\n%op_f32 = OpTypePointer Output %f32\n%op_v4f32 = OpTypePointer Output %v4f32\n%fp_f32   = OpTypePointer Function %f32\n%fp_i32   = OpTypePointer Function %i32\n%fp_v4f32 = OpTypePointer Function %v4f32\n%c_f32_1 = OpConstant %f32 1.0\n%c_f32_0 = OpConstant %f32 0.0\n%c_f32_0_5 = OpConstant %f32 0.5\n%c_f32_n1  = OpConstant %f32 -1.\n%c_f32_7 = OpConstant %f32 7.0\n%c_f32_8 = OpConstant %f32 8.0\n%c_i32_0 = OpConstant %i32 0\n%c_i32_1 = OpConstant %i32 1\n%c_i32_2 =..." /* TRUNCATED STRING LITERAL */
                  );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"tesse","");
  pSVar2 = ::vk::ProgramCollection<vk::SpirVAsmSource>::add(this,&local_30);
  ::vk::operator<<(pSVar2,(char (*) [8201])
                          "OpCapability Tessellation\nOpCapability ClipDistance\nOpCapability CullDistance\nOpMemoryModel Logical GLSL450\nOpEntryPoint TessellationEvaluation %tesse1_main \"tesse1\" %stream %gl_tessCoord %in_position %out_color %in_color \nOpEntryPoint TessellationEvaluation %tesse2_main \"tesse2\" %stream %gl_tessCoord %in_position %out_color %in_color \nOpExecutionMode %tesse1_main Triangles\nOpExecutionMode %tesse1_main SpacingEqual\nOpExecutionMode %tesse1_main VertexOrderCcw\nOpExecutionMode %tesse2_main Triangles\nOpExecutionMode %tesse2_main SpacingEqual\nOpExecutionMode %tesse2_main VertexOrderCcw\nOpName %tesse1_main \"tesse1\"\nOpName %tesse2_main \"tesse2\"\nOpName %per_vertex_out \"gl_PerVertex\"\nOpMemberName %per_vertex_out 0 \"gl_Position\"\nOpMemberName %per_vertex_out 1 \"gl_PointSize\"\nOpMemberName %per_vertex_out 2 \"gl_ClipDistance\"\nOpMemberName %per_vertex_out 3 \"gl_CullDistance\"\nOpName %stream \"\"\nOpName %gl_tessCoord \"gl_TessCoord\"\nOpName %in_position \"in_position\"\nOpName %out_color \"out_color\"\nOpName %in_color \"in_color\"\nOpMemberDecorate %per_vertex_out 0 BuiltIn Position\nOpMemberDecorate %per_vertex_out 1 BuiltIn PointSize\nOpMemberDecorate %per_vertex_out 2 BuiltIn ClipDistance\nOpMemberDecorate %per_vertex_out 3 BuiltIn CullDistance\nOpDecorate %per_vertex_out Block\nOpDecorate %gl_tessCoord BuiltIn TessCoord\nOpDecorate %in_position Location 2\nOpDecorate %out_color Location 1\nOpDecorate %in_color Location 1\n%void = OpTypeVoid\n%bool = OpTypeBool\n%i32 = OpTypeInt 32 1\n%u32 = OpTypeInt 32 0\n%f32 = OpTypeFloat 32\n%v3f32 = OpTypeVector %f32 3\n%v4i32 = OpTypeVector %i32 4\n%v4f32 = OpTypeVector %f32 4\n%v4bool = OpTypeVector %bool 4\n%v4f32_function = OpTypeFunction %v4f32 %v4f32\n%fun = OpTypeFunction %void\n%ip_f32 = OpTypePointer Input %f32\n%ip_i32 = OpTypePointer Input %i32\n%ip_v3f32 = OpTypePointer Input %v3f32\n%ip_v4f32 = OpTypePointer Input %v4f32\n%op_f32 = OpTypePointer Output %f32\n%op_v4f32 = OpTypePointer Output %v4f32\n%fp_f32   = OpTypePointer Function %f32\n%fp_i32   = OpTypePointer Function %i32\n%fp_v4f32 = OpTypePointer Function ..." /* TRUNCATED STRING LITERAL */
                  );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void createMultipleEntries(vk::SourceCollections& dst, InstanceContext)
{
	dst.spirvAsmSources.add("vert") <<
	// This module contains 2 vertex shaders. One that is a passthrough
	// and a second that inverts the color of the output (1.0 - color).
		"OpCapability Shader\n"
		"OpMemoryModel Logical GLSL450\n"
		"OpEntryPoint Vertex %main \"vert1\" %Position %vtxColor %color %vtxPosition %vertex_id %instance_id\n"
		"OpEntryPoint Vertex %main2 \"vert2\" %Position %vtxColor %color %vtxPosition %vertex_id %instance_id\n"

		"OpName %main \"vert1\"\n"
		"OpName %main2 \"vert2\"\n"
		"OpName %vtxPosition \"vtxPosition\"\n"
		"OpName %Position \"position\"\n"
		"OpName %vtxColor \"vtxColor\"\n"
		"OpName %color \"color\"\n"
		"OpName %vertex_id \"gl_VertexIndex\"\n"
		"OpName %instance_id \"gl_InstanceIndex\"\n"

		"OpDecorate %vtxPosition Location 2\n"
		"OpDecorate %Position Location 0\n"
		"OpDecorate %vtxColor Location 1\n"
		"OpDecorate %color Location 1\n"
		"OpDecorate %vertex_id BuiltIn VertexIndex\n"
		"OpDecorate %instance_id BuiltIn InstanceIndex\n"
		SPIRV_ASSEMBLY_TYPES
		SPIRV_ASSEMBLY_CONSTANTS
		SPIRV_ASSEMBLY_ARRAYS
		"%cval = OpConstantComposite %v4f32 %c_f32_1 %c_f32_1 %c_f32_1 %c_f32_0\n"
		"%vtxPosition = OpVariable %op_v4f32 Output\n"
		"%Position = OpVariable %ip_v4f32 Input\n"
		"%vtxColor = OpVariable %op_v4f32 Output\n"
		"%color = OpVariable %ip_v4f32 Input\n"
		"%vertex_id = OpVariable %ip_i32 Input\n"
		"%instance_id = OpVariable %ip_i32 Input\n"

		"%main = OpFunction %void None %fun\n"
		"%label = OpLabel\n"
		"%tmp_position = OpLoad %v4f32 %Position\n"
		"OpStore %vtxPosition %tmp_position\n"
		"%tmp_color = OpLoad %v4f32 %color\n"
		"OpStore %vtxColor %tmp_color\n"
		"OpReturn\n"
		"OpFunctionEnd\n"

		"%main2 = OpFunction %void None %fun\n"
		"%label2 = OpLabel\n"
		"%tmp_position2 = OpLoad %v4f32 %Position\n"
		"OpStore %vtxPosition %tmp_position2\n"
		"%tmp_color2 = OpLoad %v4f32 %color\n"
		"%tmp_color3 = OpFSub %v4f32 %cval %tmp_color2\n"
		"%tmp_color4 = OpVectorInsertDynamic %v4f32 %tmp_color3 %c_f32_1 %c_i32_3\n"
		"OpStore %vtxColor %tmp_color4\n"
		"OpReturn\n"
		"OpFunctionEnd\n";

	dst.spirvAsmSources.add("frag") <<
		// This is a single module that contains 2 fragment shaders.
		// One that passes color through and the other that inverts the output
		// color (1.0 - color).
		"OpCapability Shader\n"
		"OpMemoryModel Logical GLSL450\n"
		"OpEntryPoint Fragment %main \"frag1\" %vtxColor %fragColor\n"
		"OpEntryPoint Fragment %main2 \"frag2\" %vtxColor %fragColor\n"
		"OpExecutionMode %main OriginUpperLeft\n"
		"OpExecutionMode %main2 OriginUpperLeft\n"

		"OpName %main \"frag1\"\n"
		"OpName %main2 \"frag2\"\n"
		"OpName %fragColor \"fragColor\"\n"
		"OpName %vtxColor \"vtxColor\"\n"
		"OpDecorate %fragColor Location 0\n"
		"OpDecorate %vtxColor Location 1\n"
		SPIRV_ASSEMBLY_TYPES
		SPIRV_ASSEMBLY_CONSTANTS
		SPIRV_ASSEMBLY_ARRAYS
		"%cval = OpConstantComposite %v4f32 %c_f32_1 %c_f32_1 %c_f32_1 %c_f32_0\n"
		"%fragColor = OpVariable %op_v4f32 Output\n"
		"%vtxColor = OpVariable %ip_v4f32 Input\n"

		"%main = OpFunction %void None %fun\n"
		"%label_main = OpLabel\n"
		"%tmp1 = OpLoad %v4f32 %vtxColor\n"
		"OpStore %fragColor %tmp1\n"
		"OpReturn\n"
		"OpFunctionEnd\n"

		"%main2 = OpFunction %void None %fun\n"
		"%label_main2 = OpLabel\n"
		"%tmp2 = OpLoad %v4f32 %vtxColor\n"
		"%tmp3 = OpFSub %v4f32 %cval %tmp2\n"
		"%tmp4 = OpVectorInsertDynamic %v4f32 %tmp3 %c_f32_1 %c_i32_3\n"
		"OpStore %fragColor %tmp4\n"
		"OpReturn\n"
		"OpFunctionEnd\n";

	dst.spirvAsmSources.add("geom") <<
		"OpCapability Geometry\n"
		"OpCapability ClipDistance\n"
		"OpCapability CullDistance\n"
		"OpMemoryModel Logical GLSL450\n"
		"OpEntryPoint Geometry %geom1_main \"geom1\" %out_gl_position %gl_in %out_color %in_color\n"
		"OpEntryPoint Geometry %geom2_main \"geom2\" %out_gl_position %gl_in %out_color %in_color\n"
		"OpExecutionMode %geom1_main Triangles\n"
		"OpExecutionMode %geom2_main Triangles\n"
		"OpExecutionMode %geom1_main OutputTriangleStrip\n"
		"OpExecutionMode %geom2_main OutputTriangleStrip\n"
		"OpExecutionMode %geom1_main OutputVertices 3\n"
		"OpExecutionMode %geom2_main OutputVertices 3\n"
		"OpName %geom1_main \"geom1\"\n"
		"OpName %geom2_main \"geom2\"\n"
		"OpName %per_vertex_in \"gl_PerVertex\"\n"
		"OpMemberName %per_vertex_in 0 \"gl_Position\"\n"
		"OpMemberName %per_vertex_in 1 \"gl_PointSize\"\n"
		"OpMemberName %per_vertex_in 2 \"gl_ClipDistance\"\n"
		"OpMemberName %per_vertex_in 3 \"gl_CullDistance\"\n"
		"OpName %gl_in \"gl_in\"\n"
		"OpName %out_color \"out_color\"\n"
		"OpName %in_color \"in_color\"\n"
		"OpDecorate %out_gl_position BuiltIn Position\n"
		"OpMemberDecorate %per_vertex_in 0 BuiltIn Position\n"
		"OpMemberDecorate %per_vertex_in 1 BuiltIn PointSize\n"
		"OpMemberDecorate %per_vertex_in 2 BuiltIn ClipDistance\n"
		"OpMemberDecorate %per_vertex_in 3 BuiltIn CullDistance\n"
		"OpDecorate %per_vertex_in Block\n"
		"OpDecorate %out_color Location 1\n"
		"OpDecorate %in_color Location 1\n"
		SPIRV_ASSEMBLY_TYPES
		SPIRV_ASSEMBLY_CONSTANTS
		SPIRV_ASSEMBLY_ARRAYS
		"%cval = OpConstantComposite %v4f32 %c_f32_1 %c_f32_1 %c_f32_1 %c_f32_0\n"
		"%per_vertex_in = OpTypeStruct %v4f32 %f32 %a1f32 %a1f32\n"
		"%a3_per_vertex_in = OpTypeArray %per_vertex_in %c_u32_3\n"
		"%ip_a3_per_vertex_in = OpTypePointer Input %a3_per_vertex_in\n"
		"%gl_in = OpVariable %ip_a3_per_vertex_in Input\n"
		"%out_color = OpVariable %op_v4f32 Output\n"
		"%in_color = OpVariable %ip_a3v4f32 Input\n"
		"%out_gl_position = OpVariable %op_v4f32 Output\n"

		"%geom1_main = OpFunction %void None %fun\n"
		"%geom1_label = OpLabel\n"
		"%geom1_gl_in_0_gl_position = OpAccessChain %ip_v4f32 %gl_in %c_i32_0 %c_i32_0\n"
		"%geom1_gl_in_1_gl_position = OpAccessChain %ip_v4f32 %gl_in %c_i32_1 %c_i32_0\n"
		"%geom1_gl_in_2_gl_position = OpAccessChain %ip_v4f32 %gl_in %c_i32_2 %c_i32_0\n"
		"%geom1_in_position_0 = OpLoad %v4f32 %geom1_gl_in_0_gl_position\n"
		"%geom1_in_position_1 = OpLoad %v4f32 %geom1_gl_in_1_gl_position\n"
		"%geom1_in_position_2 = OpLoad %v4f32 %geom1_gl_in_2_gl_position \n"
		"%geom1_in_color_0_ptr = OpAccessChain %ip_v4f32 %in_color %c_i32_0\n"
		"%geom1_in_color_1_ptr = OpAccessChain %ip_v4f32 %in_color %c_i32_1\n"
		"%geom1_in_color_2_ptr = OpAccessChain %ip_v4f32 %in_color %c_i32_2\n"
		"%geom1_in_color_0 = OpLoad %v4f32 %geom1_in_color_0_ptr\n"
		"%geom1_in_color_1 = OpLoad %v4f32 %geom1_in_color_1_ptr\n"
		"%geom1_in_color_2 = OpLoad %v4f32 %geom1_in_color_2_ptr\n"
		"OpStore %out_gl_position %geom1_in_position_0\n"
		"OpStore %out_color %geom1_in_color_0\n"
		"OpEmitVertex\n"
		"OpStore %out_gl_position %geom1_in_position_1\n"
		"OpStore %out_color %geom1_in_color_1\n"
		"OpEmitVertex\n"
		"OpStore %out_gl_position %geom1_in_position_2\n"
		"OpStore %out_color %geom1_in_color_2\n"
		"OpEmitVertex\n"
		"OpEndPrimitive\n"
		"OpReturn\n"
		"OpFunctionEnd\n"

		"%geom2_main = OpFunction %void None %fun\n"
		"%geom2_label = OpLabel\n"
		"%geom2_gl_in_0_gl_position = OpAccessChain %ip_v4f32 %gl_in %c_i32_0 %c_i32_0\n"
		"%geom2_gl_in_1_gl_position = OpAccessChain %ip_v4f32 %gl_in %c_i32_1 %c_i32_0\n"
		"%geom2_gl_in_2_gl_position = OpAccessChain %ip_v4f32 %gl_in %c_i32_2 %c_i32_0\n"
		"%geom2_in_position_0 = OpLoad %v4f32 %geom2_gl_in_0_gl_position\n"
		"%geom2_in_position_1 = OpLoad %v4f32 %geom2_gl_in_1_gl_position\n"
		"%geom2_in_position_2 = OpLoad %v4f32 %geom2_gl_in_2_gl_position \n"
		"%geom2_in_color_0_ptr = OpAccessChain %ip_v4f32 %in_color %c_i32_0\n"
		"%geom2_in_color_1_ptr = OpAccessChain %ip_v4f32 %in_color %c_i32_1\n"
		"%geom2_in_color_2_ptr = OpAccessChain %ip_v4f32 %in_color %c_i32_2\n"
		"%geom2_in_color_0 = OpLoad %v4f32 %geom2_in_color_0_ptr\n"
		"%geom2_in_color_1 = OpLoad %v4f32 %geom2_in_color_1_ptr\n"
		"%geom2_in_color_2 = OpLoad %v4f32 %geom2_in_color_2_ptr\n"
		"%geom2_transformed_in_color_0 = OpFSub %v4f32 %cval %geom2_in_color_0\n"
		"%geom2_transformed_in_color_1 = OpFSub %v4f32 %cval %geom2_in_color_1\n"
		"%geom2_transformed_in_color_2 = OpFSub %v4f32 %cval %geom2_in_color_2\n"
		"%geom2_transformed_in_color_0_a = OpVectorInsertDynamic %v4f32 %geom2_transformed_in_color_0 %c_f32_1 %c_i32_3\n"
		"%geom2_transformed_in_color_1_a = OpVectorInsertDynamic %v4f32 %geom2_transformed_in_color_1 %c_f32_1 %c_i32_3\n"
		"%geom2_transformed_in_color_2_a = OpVectorInsertDynamic %v4f32 %geom2_transformed_in_color_2 %c_f32_1 %c_i32_3\n"
		"OpStore %out_gl_position %geom2_in_position_0\n"
		"OpStore %out_color %geom2_transformed_in_color_0_a\n"
		"OpEmitVertex\n"
		"OpStore %out_gl_position %geom2_in_position_1\n"
		"OpStore %out_color %geom2_transformed_in_color_1_a\n"
		"OpEmitVertex\n"
		"OpStore %out_gl_position %geom2_in_position_2\n"
		"OpStore %out_color %geom2_transformed_in_color_2_a\n"
		"OpEmitVertex\n"
		"OpEndPrimitive\n"
		"OpReturn\n"
		"OpFunctionEnd\n";

	dst.spirvAsmSources.add("tessc") <<
		"OpCapability Tessellation\n"
		"OpMemoryModel Logical GLSL450\n"
		"OpEntryPoint TessellationControl %tessc1_main \"tessc1\" %out_color %gl_InvocationID %in_color %out_position %in_position %gl_TessLevelOuter %gl_TessLevelInner\n"
		"OpEntryPoint TessellationControl %tessc2_main \"tessc2\" %out_color %gl_InvocationID %in_color %out_position %in_position %gl_TessLevelOuter %gl_TessLevelInner\n"
		"OpExecutionMode %tessc1_main OutputVertices 3\n"
		"OpExecutionMode %tessc2_main OutputVertices 3\n"
		"OpName %tessc1_main \"tessc1\"\n"
		"OpName %tessc2_main \"tessc2\"\n"
		"OpName %out_color \"out_color\"\n"
		"OpName %gl_InvocationID \"gl_InvocationID\"\n"
		"OpName %in_color \"in_color\"\n"
		"OpName %out_position \"out_position\"\n"
		"OpName %in_position \"in_position\"\n"
		"OpName %gl_TessLevelOuter \"gl_TessLevelOuter\"\n"
		"OpName %gl_TessLevelInner \"gl_TessLevelInner\"\n"
		"OpDecorate %out_color Location 1\n"
		"OpDecorate %gl_InvocationID BuiltIn InvocationId\n"
		"OpDecorate %in_color Location 1\n"
		"OpDecorate %out_position Location 2\n"
		"OpDecorate %in_position Location 2\n"
		"OpDecorate %gl_TessLevelOuter Patch\n"
		"OpDecorate %gl_TessLevelOuter BuiltIn TessLevelOuter\n"
		"OpDecorate %gl_TessLevelInner Patch\n"
		"OpDecorate %gl_TessLevelInner BuiltIn TessLevelInner\n"
		SPIRV_ASSEMBLY_TYPES
		SPIRV_ASSEMBLY_CONSTANTS
		SPIRV_ASSEMBLY_ARRAYS
		"%cval = OpConstantComposite %v4f32 %c_f32_1 %c_f32_1 %c_f32_1 %c_f32_0\n"
		"%out_color = OpVariable %op_a3v4f32 Output\n"
		"%gl_InvocationID = OpVariable %ip_i32 Input\n"
		"%in_color = OpVariable %ip_a32v4f32 Input\n"
		"%out_position = OpVariable %op_a3v4f32 Output\n"
		"%in_position = OpVariable %ip_a32v4f32 Input\n"
		"%gl_TessLevelOuter = OpVariable %op_a4f32 Output\n"
		"%gl_TessLevelInner = OpVariable %op_a2f32 Output\n"

		"%tessc1_main = OpFunction %void None %fun\n"
		"%tessc1_label = OpLabel\n"
		"%tessc1_invocation_id = OpLoad %i32 %gl_InvocationID\n"
		"%tessc1_in_color_ptr = OpAccessChain %ip_v4f32 %in_color %tessc1_invocation_id\n"
		"%tessc1_in_position_ptr = OpAccessChain %ip_v4f32 %in_position %tessc1_invocation_id\n"
		"%tessc1_in_color_val = OpLoad %v4f32 %tessc1_in_color_ptr\n"
		"%tessc1_in_position_val = OpLoad %v4f32 %tessc1_in_position_ptr\n"
		"%tessc1_out_color_ptr = OpAccessChain %op_v4f32 %out_color %tessc1_invocation_id\n"
		"%tessc1_out_position_ptr = OpAccessChain %op_v4f32 %out_position %tessc1_invocation_id\n"
		"OpStore %tessc1_out_color_ptr %tessc1_in_color_val\n"
		"OpStore %tessc1_out_position_ptr %tessc1_in_position_val\n"
		"%tessc1_is_first_invocation = OpIEqual %bool %tessc1_invocation_id %c_i32_0\n"
		"OpSelectionMerge %tessc1_merge_label None\n"
		"OpBranchConditional %tessc1_is_first_invocation %tessc1_first_invocation %tessc1_merge_label\n"
		"%tessc1_first_invocation = OpLabel\n"
		"%tessc1_tess_outer_0 = OpAccessChain %op_f32 %gl_TessLevelOuter %c_i32_0\n"
		"%tessc1_tess_outer_1 = OpAccessChain %op_f32 %gl_TessLevelOuter %c_i32_1\n"
		"%tessc1_tess_outer_2 = OpAccessChain %op_f32 %gl_TessLevelOuter %c_i32_2\n"
		"%tessc1_tess_inner = OpAccessChain %op_f32 %gl_TessLevelInner %c_i32_0\n"
		"OpStore %tessc1_tess_outer_0 %c_f32_1\n"
		"OpStore %tessc1_tess_outer_1 %c_f32_1\n"
		"OpStore %tessc1_tess_outer_2 %c_f32_1\n"
		"OpStore %tessc1_tess_inner %c_f32_1\n"
		"OpBranch %tessc1_merge_label\n"
		"%tessc1_merge_label = OpLabel\n"
		"OpReturn\n"
		"OpFunctionEnd\n"

		"%tessc2_main = OpFunction %void None %fun\n"
		"%tessc2_label = OpLabel\n"
		"%tessc2_invocation_id = OpLoad %i32 %gl_InvocationID\n"
		"%tessc2_in_color_ptr = OpAccessChain %ip_v4f32 %in_color %tessc2_invocation_id\n"
		"%tessc2_in_position_ptr = OpAccessChain %ip_v4f32 %in_position %tessc2_invocation_id\n"
		"%tessc2_in_color_val = OpLoad %v4f32 %tessc2_in_color_ptr\n"
		"%tessc2_in_position_val = OpLoad %v4f32 %tessc2_in_position_ptr\n"
		"%tessc2_out_color_ptr = OpAccessChain %op_v4f32 %out_color %tessc2_invocation_id\n"
		"%tessc2_out_position_ptr = OpAccessChain %op_v4f32 %out_position %tessc2_invocation_id\n"
		"%tessc2_transformed_color = OpFSub %v4f32 %cval %tessc2_in_color_val\n"
		"%tessc2_transformed_color_a = OpVectorInsertDynamic %v4f32 %tessc2_transformed_color %c_f32_1 %c_i32_3\n"
		"OpStore %tessc2_out_color_ptr %tessc2_transformed_color_a\n"
		"OpStore %tessc2_out_position_ptr %tessc2_in_position_val\n"
		"%tessc2_is_first_invocation = OpIEqual %bool %tessc2_invocation_id %c_i32_0\n"
		"OpSelectionMerge %tessc2_merge_label None\n"
		"OpBranchConditional %tessc2_is_first_invocation %tessc2_first_invocation %tessc2_merge_label\n"
		"%tessc2_first_invocation = OpLabel\n"
		"%tessc2_tess_outer_0 = OpAccessChain %op_f32 %gl_TessLevelOuter %c_i32_0\n"
		"%tessc2_tess_outer_1 = OpAccessChain %op_f32 %gl_TessLevelOuter %c_i32_1\n"
		"%tessc2_tess_outer_2 = OpAccessChain %op_f32 %gl_TessLevelOuter %c_i32_2\n"
		"%tessc2_tess_inner = OpAccessChain %op_f32 %gl_TessLevelInner %c_i32_0\n"
		"OpStore %tessc2_tess_outer_0 %c_f32_1\n"
		"OpStore %tessc2_tess_outer_1 %c_f32_1\n"
		"OpStore %tessc2_tess_outer_2 %c_f32_1\n"
		"OpStore %tessc2_tess_inner %c_f32_1\n"
		"OpBranch %tessc2_merge_label\n"
		"%tessc2_merge_label = OpLabel\n"
		"OpReturn\n"
		"OpFunctionEnd\n";

	dst.spirvAsmSources.add("tesse") <<
		"OpCapability Tessellation\n"
		"OpCapability ClipDistance\n"
		"OpCapability CullDistance\n"
		"OpMemoryModel Logical GLSL450\n"
		"OpEntryPoint TessellationEvaluation %tesse1_main \"tesse1\" %stream %gl_tessCoord %in_position %out_color %in_color \n"
		"OpEntryPoint TessellationEvaluation %tesse2_main \"tesse2\" %stream %gl_tessCoord %in_position %out_color %in_color \n"
		"OpExecutionMode %tesse1_main Triangles\n"
		"OpExecutionMode %tesse1_main SpacingEqual\n"
		"OpExecutionMode %tesse1_main VertexOrderCcw\n"
		"OpExecutionMode %tesse2_main Triangles\n"
		"OpExecutionMode %tesse2_main SpacingEqual\n"
		"OpExecutionMode %tesse2_main VertexOrderCcw\n"
		"OpName %tesse1_main \"tesse1\"\n"
		"OpName %tesse2_main \"tesse2\"\n"
		"OpName %per_vertex_out \"gl_PerVertex\"\n"
		"OpMemberName %per_vertex_out 0 \"gl_Position\"\n"
		"OpMemberName %per_vertex_out 1 \"gl_PointSize\"\n"
		"OpMemberName %per_vertex_out 2 \"gl_ClipDistance\"\n"
		"OpMemberName %per_vertex_out 3 \"gl_CullDistance\"\n"
		"OpName %stream \"\"\n"
		"OpName %gl_tessCoord \"gl_TessCoord\"\n"
		"OpName %in_position \"in_position\"\n"
		"OpName %out_color \"out_color\"\n"
		"OpName %in_color \"in_color\"\n"
		"OpMemberDecorate %per_vertex_out 0 BuiltIn Position\n"
		"OpMemberDecorate %per_vertex_out 1 BuiltIn PointSize\n"
		"OpMemberDecorate %per_vertex_out 2 BuiltIn ClipDistance\n"
		"OpMemberDecorate %per_vertex_out 3 BuiltIn CullDistance\n"
		"OpDecorate %per_vertex_out Block\n"
		"OpDecorate %gl_tessCoord BuiltIn TessCoord\n"
		"OpDecorate %in_position Location 2\n"
		"OpDecorate %out_color Location 1\n"
		"OpDecorate %in_color Location 1\n"
		SPIRV_ASSEMBLY_TYPES
		SPIRV_ASSEMBLY_CONSTANTS
		SPIRV_ASSEMBLY_ARRAYS
		"%cval = OpConstantComposite %v4f32 %c_f32_1 %c_f32_1 %c_f32_1 %c_f32_0\n"
		"%per_vertex_out = OpTypeStruct %v4f32 %f32 %a1f32 %a1f32\n"
		"%op_per_vertex_out = OpTypePointer Output %per_vertex_out\n"
		"%stream = OpVariable %op_per_vertex_out Output\n"
		"%gl_tessCoord = OpVariable %ip_v3f32 Input\n"
		"%in_position = OpVariable %ip_a32v4f32 Input\n"
		"%out_color = OpVariable %op_v4f32 Output\n"
		"%in_color = OpVariable %ip_a32v4f32 Input\n"

		"%tesse1_main = OpFunction %void None %fun\n"
		"%tesse1_label = OpLabel\n"
		"%tesse1_tc_0_ptr = OpAccessChain %ip_f32 %gl_tessCoord %c_u32_0\n"
		"%tesse1_tc_1_ptr = OpAccessChain %ip_f32 %gl_tessCoord %c_u32_1\n"
		"%tesse1_tc_2_ptr = OpAccessChain %ip_f32 %gl_tessCoord %c_u32_2\n"
		"%tesse1_tc_0 = OpLoad %f32 %tesse1_tc_0_ptr\n"
		"%tesse1_tc_1 = OpLoad %f32 %tesse1_tc_1_ptr\n"
		"%tesse1_tc_2 = OpLoad %f32 %tesse1_tc_2_ptr\n"
		"%tesse1_in_pos_0_ptr = OpAccessChain %ip_v4f32 %in_position %c_i32_0\n"
		"%tesse1_in_pos_1_ptr = OpAccessChain %ip_v4f32 %in_position %c_i32_1\n"
		"%tesse1_in_pos_2_ptr = OpAccessChain %ip_v4f32 %in_position %c_i32_2\n"
		"%tesse1_in_pos_0 = OpLoad %v4f32 %tesse1_in_pos_0_ptr\n"
		"%tesse1_in_pos_1 = OpLoad %v4f32 %tesse1_in_pos_1_ptr\n"
		"%tesse1_in_pos_2 = OpLoad %v4f32 %tesse1_in_pos_2_ptr\n"
		"%tesse1_in_pos_0_weighted = OpVectorTimesScalar %v4f32 %tesse1_in_pos_0 %tesse1_tc_0\n"
		"%tesse1_in_pos_1_weighted = OpVectorTimesScalar %v4f32 %tesse1_in_pos_1 %tesse1_tc_1\n"
		"%tesse1_in_pos_2_weighted = OpVectorTimesScalar %v4f32 %tesse1_in_pos_2 %tesse1_tc_2\n"
		"%tesse1_out_pos_ptr = OpAccessChain %op_v4f32 %stream %c_i32_0\n"
		"%tesse1_in_pos_0_plus_pos_1 = OpFAdd %v4f32 %tesse1_in_pos_0_weighted %tesse1_in_pos_1_weighted\n"
		"%tesse1_computed_out = OpFAdd %v4f32 %tesse1_in_pos_0_plus_pos_1 %tesse1_in_pos_2_weighted\n"
		"OpStore %tesse1_out_pos_ptr %tesse1_computed_out\n"
		"%tesse1_in_clr_0_ptr = OpAccessChain %ip_v4f32 %in_color %c_i32_0\n"
		"%tesse1_in_clr_1_ptr = OpAccessChain %ip_v4f32 %in_color %c_i32_1\n"
		"%tesse1_in_clr_2_ptr = OpAccessChain %ip_v4f32 %in_color %c_i32_2\n"
		"%tesse1_in_clr_0 = OpLoad %v4f32 %tesse1_in_clr_0_ptr\n"
		"%tesse1_in_clr_1 = OpLoad %v4f32 %tesse1_in_clr_1_ptr\n"
		"%tesse1_in_clr_2 = OpLoad %v4f32 %tesse1_in_clr_2_ptr\n"
		"%tesse1_in_clr_0_weighted = OpVectorTimesScalar %v4f32 %tesse1_in_clr_0 %tesse1_tc_0\n"
		"%tesse1_in_clr_1_weighted = OpVectorTimesScalar %v4f32 %tesse1_in_clr_1 %tesse1_tc_1\n"
		"%tesse1_in_clr_2_weighted = OpVectorTimesScalar %v4f32 %tesse1_in_clr_2 %tesse1_tc_2\n"
		"%tesse1_in_clr_0_plus_col_1 = OpFAdd %v4f32 %tesse1_in_clr_0_weighted %tesse1_in_clr_1_weighted\n"
		"%tesse1_computed_clr = OpFAdd %v4f32 %tesse1_in_clr_0_plus_col_1 %tesse1_in_clr_2_weighted\n"
		"OpStore %out_color %tesse1_computed_clr\n"
		"OpReturn\n"
		"OpFunctionEnd\n"

		"%tesse2_main = OpFunction %void None %fun\n"
		"%tesse2_label = OpLabel\n"
		"%tesse2_tc_0_ptr = OpAccessChain %ip_f32 %gl_tessCoord %c_u32_0\n"
		"%tesse2_tc_1_ptr = OpAccessChain %ip_f32 %gl_tessCoord %c_u32_1\n"
		"%tesse2_tc_2_ptr = OpAccessChain %ip_f32 %gl_tessCoord %c_u32_2\n"
		"%tesse2_tc_0 = OpLoad %f32 %tesse2_tc_0_ptr\n"
		"%tesse2_tc_1 = OpLoad %f32 %tesse2_tc_1_ptr\n"
		"%tesse2_tc_2 = OpLoad %f32 %tesse2_tc_2_ptr\n"
		"%tesse2_in_pos_0_ptr = OpAccessChain %ip_v4f32 %in_position %c_i32_0\n"
		"%tesse2_in_pos_1_ptr = OpAccessChain %ip_v4f32 %in_position %c_i32_1\n"
		"%tesse2_in_pos_2_ptr = OpAccessChain %ip_v4f32 %in_position %c_i32_2\n"
		"%tesse2_in_pos_0 = OpLoad %v4f32 %tesse2_in_pos_0_ptr\n"
		"%tesse2_in_pos_1 = OpLoad %v4f32 %tesse2_in_pos_1_ptr\n"
		"%tesse2_in_pos_2 = OpLoad %v4f32 %tesse2_in_pos_2_ptr\n"
		"%tesse2_in_pos_0_weighted = OpVectorTimesScalar %v4f32 %tesse2_in_pos_0 %tesse2_tc_0\n"
		"%tesse2_in_pos_1_weighted = OpVectorTimesScalar %v4f32 %tesse2_in_pos_1 %tesse2_tc_1\n"
		"%tesse2_in_pos_2_weighted = OpVectorTimesScalar %v4f32 %tesse2_in_pos_2 %tesse2_tc_2\n"
		"%tesse2_out_pos_ptr = OpAccessChain %op_v4f32 %stream %c_i32_0\n"
		"%tesse2_in_pos_0_plus_pos_1 = OpFAdd %v4f32 %tesse2_in_pos_0_weighted %tesse2_in_pos_1_weighted\n"
		"%tesse2_computed_out = OpFAdd %v4f32 %tesse2_in_pos_0_plus_pos_1 %tesse2_in_pos_2_weighted\n"
		"OpStore %tesse2_out_pos_ptr %tesse2_computed_out\n"
		"%tesse2_in_clr_0_ptr = OpAccessChain %ip_v4f32 %in_color %c_i32_0\n"
		"%tesse2_in_clr_1_ptr = OpAccessChain %ip_v4f32 %in_color %c_i32_1\n"
		"%tesse2_in_clr_2_ptr = OpAccessChain %ip_v4f32 %in_color %c_i32_2\n"
		"%tesse2_in_clr_0 = OpLoad %v4f32 %tesse2_in_clr_0_ptr\n"
		"%tesse2_in_clr_1 = OpLoad %v4f32 %tesse2_in_clr_1_ptr\n"
		"%tesse2_in_clr_2 = OpLoad %v4f32 %tesse2_in_clr_2_ptr\n"
		"%tesse2_in_clr_0_weighted = OpVectorTimesScalar %v4f32 %tesse2_in_clr_0 %tesse2_tc_0\n"
		"%tesse2_in_clr_1_weighted = OpVectorTimesScalar %v4f32 %tesse2_in_clr_1 %tesse2_tc_1\n"
		"%tesse2_in_clr_2_weighted = OpVectorTimesScalar %v4f32 %tesse2_in_clr_2 %tesse2_tc_2\n"
		"%tesse2_in_clr_0_plus_col_1 = OpFAdd %v4f32 %tesse2_in_clr_0_weighted %tesse2_in_clr_1_weighted\n"
		"%tesse2_computed_clr = OpFAdd %v4f32 %tesse2_in_clr_0_plus_col_1 %tesse2_in_clr_2_weighted\n"
		"%tesse2_clr_transformed = OpFSub %v4f32 %cval %tesse2_computed_clr\n"
		"%tesse2_clr_transformed_a = OpVectorInsertDynamic %v4f32 %tesse2_clr_transformed %c_f32_1 %c_i32_3\n"
		"OpStore %out_color %tesse2_clr_transformed_a\n"
		"OpReturn\n"
		"OpFunctionEnd\n";
}